

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnPredictForFile(XL *out,char *model_path,char *out_path)

{
  Solver *this;
  HyperParam *hyper_param;
  float fVar1;
  allocator local_49;
  string local_48;
  Timer timer;
  
  Timer::Timer(&timer);
  Timer::tic(&timer);
  hyper_param = (HyperParam *)*out;
  std::__cxx11::string::string((string *)&local_48,model_path,&local_49);
  std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,out_path,&local_49);
  std::__cxx11::string::operator=((string *)&hyper_param->output_file,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this = (Solver *)(hyper_param + 1);
  hyper_param->res_out = true;
  hyper_param->is_train = false;
  xLearn::Solver::Initialize(this,hyper_param);
  (this->hyper_param_).is_train = false;
  xLearn::Solver::StartWork(this);
  xLearn::Solver::Clear(this);
  fVar1 = Timer::toc(&timer);
  StringPrintf_abi_cxx11_(&local_48,"Total time cost: %.2f (sec)",(double)fVar1);
  Color::print_info(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  return 0;
}

Assistant:

XL_DLL int XLearnPredictForFile(XL *out, const char *model_path, 
                         const char *out_path) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().output_file = std::string(out_path);
  xl->GetHyperParam().res_out = true;
  xl->GetHyperParam().is_train = false;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().SetPredict();
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}